

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint16_t nlocals;
  gravity_function_t *f;
  gravity_vm *vm;
  gnode_t *node_00;
  ulong uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  ircode_t *piVar6;
  gravity_function_t *f_00;
  void *pvVar7;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  void **ppvVar12;
  bool bVar13;
  long lVar14;
  long lVar15;
  gnode_t *pgVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar20;
  gravity_function_t *local_78;
  long local_70;
  void *local_68 [2];
  void *local_58;
  gnode_t *local_50;
  gravity_class_t *local_48;
  gravity_class_t *local_40;
  ulong local_38;
  
  if (node->storage != TOK_KEY_EXTERN) {
    f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    local_40 = f->isa;
    if (local_40 == gravity_class_function) {
      iVar4 = string_cmp(f->identifier,"$moduleinit");
      bVar18 = iVar4 == 0;
      local_40 = f->isa;
    }
    else {
      bVar18 = false;
    }
    local_48 = gravity_class_class;
    bVar19 = local_40 == gravity_class_class;
    if ((node->decls != (gnode_r *)0x0) && (local_38 = node->decls->n, local_38 != 0)) {
      uVar10 = 0;
      do {
        if (uVar10 < node->decls->n) {
          pgVar16 = node->decls->p[uVar10];
        }
        else {
          pgVar16 = (gnode_t *)0x0;
        }
        if ((bool)(bVar19 | bVar18)) {
          if (bVar18) {
            piVar6 = (ircode_t *)(f->field_9).field_0.bytecode;
            vm = *(gravity_vm **)((long)self->data + 0x38);
            gVar20 = gravity_string_to_value
                               ((gravity_vm *)0x0,*(char **)&pgVar16[1].block_length,0xffffffff);
            uVar3 = gravity_function_cpool_add(vm,f,gVar20);
            pgVar16 = *(gnode_t **)&pgVar16[1].token.colno;
            if (pgVar16 == (gnode_t *)0x0) {
              ircode_add_constant(piVar6,0x1002,(node->base).token.lineno);
            }
            else {
              gvisit(self,pgVar16);
            }
            uVar5 = ircode_register_pop(piVar6);
            if (uVar5 == 0xffffffff) {
              report_error(self,&node->base,"Invalid var expression.");
            }
            ircode_add(piVar6,STOREG,uVar5,(uint)uVar3,0,(node->base).token.lineno);
          }
          else {
            if (local_40 != local_48) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                            ,0x4e9,"void visit_variable_decl(gvisitor_t *, gnode_variable_decl_t *)"
                           );
            }
            local_78 = f;
            if (node->storage == TOK_KEY_STATIC) {
              local_78 = (gravity_function_t *)f->xdata;
            }
            lVar14 = *(long *)&pgVar16[1].token.colno;
            if ((lVar14 == 0) || (*(char *)((long)&pgVar16[1].token.length + 3) != '\x01')) {
              if (node->access == TOK_KEY_PUBLIC) {
                aVar8.p = (gravity_object_t *)
                          gravity_function_new_special
                                    ((gravity_vm *)0x0,(char *)0x0,(uint16_t)pgVar16[1].token.length
                                     ,(void *)0x0,(void *)0x0);
                gVar20.field_1.p = (gravity_object_t *)aVar8.n;
                gVar20.isa = (aVar8.p)->isa;
                gravity_class_bind((gravity_class_t *)local_78,*(char **)&pgVar16[1].block_length,
                                   gVar20);
                lVar14._0_4_ = pgVar16[1].token.colno;
                lVar14._4_4_ = pgVar16[1].token.position;
              }
              if (lVar14 != 0) {
                aVar8.p = (gravity_object_t *)
                          class_lookup_nosuper((gravity_class_t *)local_78,"$init");
                if ((gravity_function_t *)aVar8.n == (gravity_function_t *)0x0) {
                  piVar6 = ircode_create(1);
                  aVar8.p = (gravity_object_t *)
                            gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar6);
                  value.field_1.p = (gravity_object_t *)aVar8.n;
                  value.isa = (aVar8.p)->isa;
                  gravity_class_bind((gravity_class_t *)local_78,"$init",value);
                }
                plVar9 = (long *)self->data;
                lVar11 = *plVar9;
                if (lVar11 == plVar9[1]) {
                  lVar14 = lVar11 * 2;
                  if (lVar11 == 0) {
                    lVar14 = 8;
                  }
                  plVar9[1] = lVar14;
                  pvVar7 = realloc((void *)plVar9[2],lVar14 << 3);
                  plVar9 = (long *)self->data;
                  plVar9[2] = (long)pvVar7;
                  lVar11 = *plVar9;
                }
                else {
                  pvVar7 = (void *)plVar9[2];
                }
                *plVar9 = lVar11 + 1;
                ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar7 + lVar11 * 8))->p =
                     (gravity_object_t *)aVar8;
                piVar6 = *(ircode_t **)(aVar8.n + 0xa0);
                gvisit(self,*(gnode_t **)&pgVar16[1].token.colno);
                uVar5 = ircode_register_pop(piVar6);
                if (uVar5 == 0xffffffff) {
                  report_error(self,&node->base,"Invalid var expression.");
                }
                ircode_add(piVar6,STORE,uVar5,0,(ushort)pgVar16[1].token.length + 0x100,
                           (node->base).token.lineno);
                *(long *)self->data = *self->data + -1;
              }
            }
            else {
              lVar11 = **(long **)(lVar14 + 0x50);
              if (lVar11 == 0) {
                lVar14 = 0;
LAB_00139e60:
                local_70 = 0;
              }
              else {
                plVar9 = (long *)(*(long **)(lVar14 + 0x50))[2];
                lVar14 = *plVar9;
                if (lVar11 == 1) goto LAB_00139e60;
                local_70 = plVar9[1];
              }
              local_68[0] = (void *)0x0;
              local_58 = (void *)0x0;
              ppvVar12 = local_68;
              bVar2 = true;
              local_50 = pgVar16;
              do {
                bVar13 = bVar2;
                if (lVar14 != 0) {
                  if (*(uint16_t **)(lVar14 + 0x68) == (uint16_t *)0x0) {
                    uVar3 = 0;
                  }
                  else {
                    uVar3 = **(uint16_t **)(lVar14 + 0x68);
                  }
                  nlocals = *(uint16_t *)(lVar14 + 0x78);
                  piVar6 = ircode_create(uVar3 + nlocals);
                  f_00 = gravity_function_new((gravity_vm *)0x0,(char *)0x0,uVar3,nlocals,0,piVar6);
                  *ppvVar12 = f_00;
                  plVar9 = (long *)self->data;
                  lVar11 = *plVar9;
                  if (lVar11 == plVar9[1]) {
                    lVar15 = lVar11 * 2;
                    if (lVar11 == 0) {
                      lVar15 = 8;
                    }
                    plVar9[1] = lVar15;
                    pvVar7 = realloc((void *)plVar9[2],lVar15 << 3);
                    plVar9 = (long *)self->data;
                    plVar9[2] = (long)pvVar7;
                    lVar11 = *plVar9;
                  }
                  else {
                    pvVar7 = (void *)plVar9[2];
                  }
                  *plVar9 = lVar11 + 1;
                  *(gravity_function_t **)((long)pvVar7 + lVar11 * 8) = f_00;
                  lVar11 = *(long *)(lVar14 + 0x70);
                  if (((lVar11 != 0) && (*(ulong **)(lVar11 + 0x50) != (ulong *)0x0)) &&
                     (uVar1 = **(ulong **)(lVar11 + 0x50), uVar1 != 0)) {
                    uVar17 = 0;
                    do {
                      if (uVar17 < **(ulong **)(lVar11 + 0x50)) {
                        pgVar16 = *(gnode_t **)((*(ulong **)(lVar11 + 0x50))[2] + uVar17 * 8);
                      }
                      else {
                        pgVar16 = (gnode_t *)0x0;
                      }
                      gvisit(self,pgVar16);
                      uVar17 = uVar17 + 1;
                    } while (uVar1 != uVar17);
                  }
                  *(long *)self->data = *self->data + -1;
                  gravity_optimizer(f_00,self->bflag);
                }
                ppvVar12 = &local_58;
                lVar14 = local_70;
                bVar2 = false;
              } while (bVar13);
              aVar8.p = (gravity_object_t *)
                        gravity_function_new_special
                                  ((gravity_vm *)0x0,(char *)0x0,0xfffe,local_68[0],local_58);
              value_00.field_1.p = (gravity_object_t *)aVar8.n;
              value_00.isa = (aVar8.p)->isa;
              gravity_class_bind((gravity_class_t *)local_78,*(char **)&local_50[1].block_length,
                                 value_00);
            }
          }
        }
        else {
          node_00 = *(gnode_t **)&pgVar16[1].token.colno;
          if (node_00 == (gnode_t *)0x0) {
            piVar6 = (ircode_t *)(f->field_9).field_0.bytecode;
LAB_00139dbf:
            ircode_add(piVar6,LOADK,(uint)(ushort)pgVar16[1].token.length,0x1002,0,
                       (node->base).token.lineno);
          }
          else if (node_00->tag != NODE_ENUM_DECL) {
            gvisit(self,node_00);
            piVar6 = (ircode_t *)(f->field_9).field_0.bytecode;
            lVar11._0_4_ = pgVar16[1].token.colno;
            lVar11._4_4_ = pgVar16[1].token.position;
            if (lVar11 == 0) goto LAB_00139dbf;
            uVar5 = ircode_register_pop(piVar6);
            if (uVar5 == 0xffffffff) {
              report_error(self,&node->base,"Invalid var expression.");
            }
            ircode_add(piVar6,MOVE,(uint)(ushort)pgVar16[1].token.length,uVar5,0,
                       (node->base).token.lineno);
            ircode_add_check(piVar6);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_38);
    }
  }
  return;
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    DEBUG_CODEGEN("visit_variable_decl");
    DECLARE_CONTEXT();

    // no initialization for extern variables since the real value will be provided at runtime
    if (node->storage == TOK_KEY_EXTERN) return;

    bool is_module = CONTEXT_IS_MODULE(context_object);
    bool is_class = OBJECT_ISA_CLASS(context_object);
    bool is_local = ((is_module == false) && (is_class == false));

    // loop through declarations
    size_t count = gnode_array_size(node->decls);
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_CODEGEN("visit_variable_decl %s", p->identifier);

        // variable declarations can be specified in:
        // FUNCTION (local variable)
        // MODULE (module variable)
        // CLASS (property)

        if (is_local) {
            // it is a local variable declaration (default initialized to NULL)
            // code is generate ONLY if an init expression is specified
            //
            //    example:
            //
            //    func foo () {
            //        var a = 10;
            //    }
            //
            //    LOADI    1 10    ; move 10 into register 1
            //    MOVE    0 1        ; move register 1 into register 0
            //

            // generate expression code (if it is not a local enum)
            if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
            if (p->expr) visit(p->expr); // context is a function

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            if (p->expr) {
                // assign to variable result of the expression
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, MOVE, p->index, reg, 0, LINE_NUMBER(node));
                // Checkpoint added to support STRUCT
                ircode_add_check(code);
            } else {
                // no default assignment expression found so initialize to NULL
				ircode_add(code, LOADK, p->index, CPOOL_VALUE_NULL, 0, LINE_NUMBER(node));
            }
            continue;
        }

        if (is_module) {
            // it is a module variable (default initialized to null)
            // code must ALWAYS be generated
            //
            // example 1:
            //    var a;
            //
            //    LOADK    0 NULL   ; move null into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //
            // example 2:
            //    var a = 10;
            //
            //    LOADI    0 10     ; move 10 into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, p->identifier));

            if (p->expr) {
                visit(p->expr); // context is a function
            } else {
				ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            }
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
			ircode_add(code, STOREG, reg, index, 0, LINE_NUMBER(node));
            continue;
        }

        if (is_class) {
            bool is_static = (node->storage == TOK_KEY_STATIC);
            gravity_class_t *context_class = (is_static) ? ((gravity_class_t *)context_object)->objclass : (gravity_class_t *)context_object;

            // check computed property case first
            if ((p->expr) && (p->iscomputed)) {
                process_getter_setter(self, p, context_class);
                continue;
            }

            // create ivar first
            uint16_t ivar_index = (p->index >= 0) ? p->index : gravity_class_add_ivar(context_class, NULL);

            // add default getter and setter ONLY if property is public
            if (node->access == TOK_KEY_PUBLIC) {
                // since getter and setter are methods and not simple functions, do not transfer to VM
                gravity_function_t *f = gravity_function_new_special(NULL, NULL, ivar_index, NULL, NULL); // getter and setter NULL means default
                gravity_class_bind(context_class, p->identifier, VALUE_FROM_OBJECT(f));
            }
            DEBUG_CODEGEN("Class: %s (static: %d) property: %s index: %d", context_class->identifier, is_static, p->identifier, ivar_index);

            // it is a property (default initialized to null)
            // code must be generated ONLY if an init expression is specified

            //
            //  example:
            //     class foo {
            //         var a = 10;
            //     }
            //
            //  get $init function
            //  depending if variable has been created static
            //  and push it as current declaration then:
            //
            //     LOADI     0 10   ; move 10 into register 0
            //     STOREF    0 0    ; move register 0 into property 0

            if (p->expr) {
                // was gravity_class_lookup but that means than $init or init will be recursively searched also in super classes
                gravity_function_t *init_function = class_lookup_nosuper(context_class, CLASS_INTERNAL_INIT_NAME);
                if (init_function == NULL) {
                    // no $init method found so create a new one
                    init_function = gravity_function_new (NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));
                    gravity_class_bind(context_class, CLASS_INTERNAL_INIT_NAME, VALUE_FROM_OBJECT(init_function));
                }

                CONTEXT_PUSH(init_function);
                ircode_t *code = (ircode_t *)init_function->bytecode;
                visit(p->expr);
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, STORE, reg, 0, p->index + MAX_REGISTERS, LINE_NUMBER(node));
                CONTEXT_POP();
            }

            continue;
        }

        // should never reach this point
        assert(0);
    }
}